

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::NetState::SerializeWithCachedSizes(NetState *this,CodedOutputStream *output)

{
  uint uVar1;
  Phase value;
  int32 value_00;
  int iVar2;
  int size;
  char *data;
  string *value_01;
  UnknownFieldSet *unknown_fields;
  int local_40;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  NetState *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 2) != 0) {
    value = phase(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(1,value,output);
  }
  if ((uVar1 & 1) != 0) {
    value_00 = level(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(2,value_00,output);
  }
  local_40 = 0;
  iVar2 = stage_size(this);
  for (; local_40 < iVar2; local_40 = local_40 + 1) {
    stage_abi_cxx11_(this,local_40);
    data = (char *)std::__cxx11::string::data();
    stage_abi_cxx11_(this,local_40);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (data,size,SERIALIZE,"caffe.NetState.stage");
    value_01 = stage_abi_cxx11_(this,local_40);
    google::protobuf::internal::WireFormatLite::WriteString(3,value_01,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = NetState::unknown_fields(this);
    google::protobuf::internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void NetState::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.NetState)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.Phase phase = 1 [default = TEST];
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->phase(), output);
  }

  // optional int32 level = 2 [default = 0];
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(2, this->level(), output);
  }

  // repeated string stage = 3;
  for (int i = 0, n = this->stage_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->stage(i).data(), this->stage(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetState.stage");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      3, this->stage(i), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.NetState)
}